

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-stop.c
# Opt level: O2

int run_test_loop_stop(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_a;
  
  puVar2 = uv_default_loop();
  uv_prepare_init(puVar2,&prepare_handle);
  uv_prepare_start(&prepare_handle,prepare_cb);
  puVar2 = uv_default_loop();
  uv_timer_init(puVar2,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,100,100);
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    uVar6 = 0x3a;
LAB_00155108:
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-stop.c"
            ,uVar6,"r");
    abort();
  }
  eval_a = 1;
  eval_b = (int64_t)timer_called;
  if (eval_b == 1) {
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_NOWAIT);
    if (iVar1 == 0) {
      uVar6 = 0x3e;
      goto LAB_00155108;
    }
    eval_a = (int64_t)prepare_called;
    eval_b = 1;
    if (eval_a < 2) {
      pcVar4 = ">";
      pcVar5 = "1";
      pcVar3 = "prepare_called";
      uVar6 = 0x3f;
    }
    else {
      puVar2 = uv_default_loop();
      iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        eval_a = 10;
        eval_b = (int64_t)timer_called;
        if (eval_b == 10) {
          eval_a = 10;
          eval_b = (int64_t)prepare_called;
          if (eval_b == 10) {
            puVar2 = uv_default_loop();
            close_loop(puVar2);
            eval_a = 0;
            puVar2 = uv_default_loop();
            iVar1 = uv_loop_close(puVar2);
            eval_b = (int64_t)iVar1;
            if (eval_b == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar4 = "==";
            pcVar5 = "uv_loop_close(uv_default_loop())";
            pcVar3 = "0";
            uVar6 = 0x46;
          }
          else {
            pcVar4 = "==";
            pcVar5 = "prepare_called";
            pcVar3 = "10";
            uVar6 = 0x44;
          }
        }
        else {
          pcVar4 = "==";
          pcVar5 = "timer_called";
          pcVar3 = "10";
          uVar6 = 0x43;
        }
      }
      else {
        pcVar4 = "==";
        pcVar5 = "0";
        pcVar3 = "r";
        uVar6 = 0x42;
      }
    }
  }
  else {
    pcVar4 = "==";
    pcVar5 = "timer_called";
    pcVar3 = "1";
    uVar6 = 0x3b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-stop.c"
          ,uVar6,pcVar3,pcVar4,pcVar5,eval_a,pcVar4,eval_b);
  abort();
}

Assistant:

TEST_IMPL(loop_stop) {
  int r;
  uv_prepare_init(uv_default_loop(), &prepare_handle);
  uv_prepare_start(&prepare_handle, prepare_cb);
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r);
  ASSERT_EQ(1, timer_called);

  r = uv_run(uv_default_loop(), UV_RUN_NOWAIT);
  ASSERT(r);
  ASSERT_GT(prepare_called, 1);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(10, timer_called);
  ASSERT_EQ(10, prepare_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}